

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void bitset_flip_range(uint64_t *words,uint32_t start,uint32_t end)

{
  uint uVar1;
  uint32_t i;
  uint32_t endword;
  uint32_t firstword;
  uint32_t end_local;
  uint32_t start_local;
  uint64_t *words_local;
  
  if (start != end) {
    i = start >> 6;
    uVar1 = end - 1 >> 6;
    words[i] = -1L << ((byte)start & 0x3f) ^ 0xffffffffffffffffU ^ words[i];
    for (; i < uVar1; i = i + 1) {
      words[i] = words[i] ^ 0xffffffffffffffff;
    }
    words[uVar1] = 0xffffffffffffffffU >> (((byte)end ^ 0xff) + 1 & 0x3f) ^ words[uVar1];
  }
  return;
}

Assistant:

static inline void bitset_flip_range(uint64_t *words, uint32_t start,
                                     uint32_t end) {
    if (start == end) return;
    uint32_t firstword = start / 64;
    uint32_t endword = (end - 1) / 64;
    words[firstword] ^= ~((~UINT64_C(0)) << (start % 64));
    for (uint32_t i = firstword; i < endword; i++) {
        words[i] = ~words[i];
    }
    words[endword] ^= ((~UINT64_C(0)) >> ((~end + 1) % 64));
}